

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t archive_match_path_unmatched_inclusions_next_w(archive *_a,wchar_t **_p)

{
  int iVar1;
  wchar_t magic_test;
  wchar_t r;
  void *v;
  archive_match *a;
  wchar_t **_p_local;
  archive *_a_local;
  
  a = (archive_match *)_p;
  _p_local = (wchar_t **)_a;
  iVar1 = __archive_check_magic(_a,0xcad11c9,1,"archive_match_unmatched_inclusions_next_w");
  if (iVar1 == -0x1e) {
    _a_local._4_4_ = L'\xffffffe2';
  }
  else {
    v = _p_local;
    _a_local._4_4_ =
         match_list_unmatched_inclusions_next
                   ((archive_match *)_p_local,(match_list *)(_p_local + 0x18),L'\0',
                    (void **)&magic_test);
    *(void **)&a->archive = _magic_test;
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_match_path_unmatched_inclusions_next_w(struct archive *_a,
    const wchar_t **_p)
{
	struct archive_match *a;
	const void *v;
	int r;

	archive_check_magic(_a, ARCHIVE_MATCH_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_match_unmatched_inclusions_next_w");
	a = (struct archive_match *)_a;

	r = match_list_unmatched_inclusions_next(a, &(a->inclusions), 0, &v);
	*_p = (const wchar_t *)v;
	return (r);
}